

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexInternalShape.cpp
# Opt level: O1

cbtVector3 __thiscall
cbtConvexInternalShape::localGetSupportingVertex(cbtConvexInternalShape *this,cbtVector3 *vec)

{
  cbtScalar cVar1;
  cbtScalar cVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float in_XMM0_Da;
  float fVar9;
  float fVar10;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  ulong uVar11;
  cbtVector3 cVar12;
  float local_28;
  undefined4 uStack_24;
  
  (*(this->super_cbtConvexShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x11])();
  fVar7 = in_XMM0_Da;
  (*(this->super_cbtConvexShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(this);
  if ((fVar7 != 0.0) || (NAN(fVar7))) {
    cVar1 = vec->m_floats[0];
    fVar7 = vec->m_floats[1];
    cVar2 = vec->m_floats[2];
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7)),ZEXT416((uint)cVar1),
                             ZEXT416((uint)cVar1));
    auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)cVar2),ZEXT416((uint)cVar2));
    bVar5 = auVar4._0_4_ < 1.4210855e-14;
    fVar6 = (float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * (int)cVar1);
    fVar7 = (float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * (int)fVar7);
    fVar8 = (float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * (int)cVar2);
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7)),ZEXT416((uint)fVar6),
                             ZEXT416((uint)fVar6));
    auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
    if (auVar4._0_4_ < 0.0) {
      fVar9 = sqrtf(auVar4._0_4_);
    }
    else {
      auVar4 = vsqrtss_avx(auVar4,auVar4);
      fVar9 = auVar4._0_4_;
    }
    fVar9 = 1.0 / fVar9;
    fVar10 = fVar9 * fVar8;
    (*(this->super_cbtConvexShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(this);
    auVar4._4_4_ = in_XMM0_Db;
    auVar4._0_4_ = in_XMM0_Da;
    auVar4._8_4_ = in_XMM0_Dc;
    auVar4._12_4_ = in_XMM0_Dd;
    auVar4 = vmovshdup_avx(auVar4);
    auVar4 = vinsertps_avx(ZEXT416((uint)(in_XMM0_Da + fVar10 * fVar9 * fVar6)),
                           ZEXT416((uint)(auVar4._0_4_ + fVar10 * fVar9 * fVar7)),0x10);
    uVar3 = auVar4._0_8_;
    uVar11 = (ulong)(uint)(local_28 + fVar10 * fVar9 * fVar8);
  }
  else {
    uVar11 = CONCAT44(uStack_24,local_28);
    uVar3 = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  }
  cVar12.m_floats[2] = (cbtScalar)(int)uVar11;
  cVar12.m_floats[3] = (cbtScalar)(int)(uVar11 >> 0x20);
  cVar12.m_floats[0] = (cbtScalar)(int)uVar3;
  cVar12.m_floats[1] = (cbtScalar)(int)((ulong)uVar3 >> 0x20);
  return (cbtVector3)cVar12.m_floats;
}

Assistant:

cbtVector3 cbtConvexInternalShape::localGetSupportingVertex(const cbtVector3& vec) const
{
#ifndef __SPU__

	cbtVector3 supVertex = localGetSupportingVertexWithoutMargin(vec);

	if (getMargin() != cbtScalar(0.))
	{
		cbtVector3 vecnorm = vec;
		if (vecnorm.length2() < (SIMD_EPSILON * SIMD_EPSILON))
		{
			vecnorm.setValue(cbtScalar(-1.), cbtScalar(-1.), cbtScalar(-1.));
		}
		vecnorm.normalize();
		supVertex += getMargin() * vecnorm;
	}
	return supVertex;

#else
	cbtAssert(0);
	return cbtVector3(0, 0, 0);
#endif  //__SPU__
}